

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O2

int Test_N_VAbs(N_Vector X,N_Vector Z,sunindextype param_3,int myid)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  N_VConst(-1.0,X);
  N_VConst(0.0,Z);
  dVar2 = get_time();
  N_VAbs(X,Z);
  sync_device();
  dVar3 = get_time();
  iVar1 = check_ans(1.0,Z,param_3);
  if (iVar1 == 0) {
    iVar1 = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VAbs ");
      iVar1 = 0;
    }
  }
  else {
    printf(">>> FAILED test -- N_VAbs, Proc %d \n",(ulong)(uint)myid);
    iVar1 = 1;
  }
  max_time(X,dVar3 - dVar2);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VAbs");
  }
  return iVar1;
}

Assistant:

int Test_N_VAbs(N_Vector X, N_Vector Z, sunindextype local_length, int myid)
{
  int      fails = 0, failure = 0;
  double   start_time, stop_time, maxt;

  /* fill vector data */
  N_VConst(NEG_ONE, X);
  N_VConst(ZERO, Z);

  start_time = get_time();
  N_VAbs(X,Z);
  sync_device();
  stop_time = get_time();

  /* Z should be vector of +1 */
  failure = check_ans(ONE, Z, local_length);

  if (failure) {
    printf(">>> FAILED test -- N_VAbs, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VAbs \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VAbs", maxt);

  return(fails);
}